

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertionResult::operator!(AssertionResult *__return_storage_ptr__,AssertionResult *this)

{
  bool result;
  AssertionResult *rhs;
  char *local_48;
  AssertionResult local_40;
  AssertionResult *local_18;
  AssertionResult *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  result = failed(this);
  AssertionResult(&local_40,result);
  local_48 = message(this);
  rhs = operator<<(&local_40,&local_48);
  AssertionResult(__return_storage_ptr__,rhs);
  ~AssertionResult(&local_40);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult operator ! () const
    {
        return AssertionResult(failed()) << message();
    }